

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scv.c
# Opt level: O3

void scv(void)

{
  int iVar1;
  scv_vector *psVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  scv_vector *psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int data1_8 [5];
  int data1 [3];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  long lVar11;
  
  iVar1 = greatest_test_pre("new_objsize_zero");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(0,1);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x43;
      greatest_info.msg = "v == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_capacity_zero");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(1,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x4e;
      greatest_info.msg = "v != NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_objsize_max");
  if (iVar1 == 1) {
    iVar1 = 0;
    psVar2 = scv_new(0xffffffffffffffff,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x5b;
      greatest_info.msg = "v == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("new_capacity_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (psVar2 == (scv_vector *)0x0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x66;
      greatest_info.msg = "v == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("delete_null");
  if (iVar1 == 1) {
    scv_delete((scv_vector *)0x0);
    greatest_info.msg = (char *)0x0;
    greatest_test_post(0);
  }
  iVar1 = greatest_test_pre("at_inside");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_at(psVar2,1);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != (void *)((long)psVar2->data + 4))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x81;
      greatest_info.msg = "p != NULL && p == (int *) v->data + 1";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("at_outside");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = 0;
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_at(psVar2,6);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x93;
      greatest_info.msg = "p == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("at_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = 0;
    pvVar3 = scv_at(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xa3;
      greatest_info.msg = "p == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("front_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_front(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xb7;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("front_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_front(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 199;
      greatest_info.msg = "p == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != (void *)((long)psVar2->data + 0x10))) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xdb;
      greatest_info.msg = "p != NULL && p == (int *) v->data + 4";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_single");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,1);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xed;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("back_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0xfd;
      greatest_info.msg = "p == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("data_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    pvVar3 = scv_data(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((pvVar3 == (void *)0x0) || (pvVar3 != psVar2->data)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x111;
      greatest_info.msg = "p != NULL && p == (int *) v->data";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("data_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    pvVar3 = scv_data(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (pvVar3 == (void *)0x0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x121;
      greatest_info.msg = "p == NULL";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("empty_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_empty(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x133;
      greatest_info.msg = "res != 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("empty_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,1);
    iVar1 = scv_empty(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x145;
      greatest_info.msg = "res == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("size_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x154;
      greatest_info.msg = "v != NULL && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("size_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    scv_resize(psVar2,10);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_size(psVar2), sVar4 != 10)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x163;
      greatest_info.msg = "v != NULL && scv_size(v) == 10";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("objsize");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_objsize(psVar2), sVar4 != 3)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x172;
      greatest_info.msg = "v != NULL && scv_objsize(v) == 3";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_zero");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_reserve(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 100)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x184;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v) == 100";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_below_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x50);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x196;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_equals_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,100);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1a8;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_above_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x6e);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x78)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1ba;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 120";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_above_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,0x78);
    scv_resize(psVar2,100);
    iVar1 = scv_reserve(psVar2,0x8c);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 100)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x8c)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1cc;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 100 && scv_capacity(v) == 140";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("reserve_capacity_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_reserve(psVar2,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1dc;
      greatest_info.msg = "res != SCV_OK";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(3,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((psVar2 == (scv_vector *)0x0) || (sVar4 = scv_capacity(psVar2), sVar4 < 0x19)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1eb;
      greatest_info.msg = "v != NULL && scv_capacity(v) >= 25";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 != 0)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x1fd;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v) > 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_equals_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,100);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_capacity(psVar2);
      if (sVar4 != sVar5) goto LAB_001023b1;
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
LAB_001023b1:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x20f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == scv_capacity(v)";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_below_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_resize(psVar2,0x50);
    iVar1 = scv_shrink_to_fit(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_capacity(psVar2);
      if (sVar4 != sVar5) goto LAB_00102463;
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
LAB_00102463:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x221;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == scv_capacity(v)";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("clear_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    scv_insert(psVar2,0,(void *)0x0,5);
    iVar1 = scv_clear(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x235;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0 && scv_capacity(v) == 25";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("clear_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_clear(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) &&
       (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x245;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0 && scv_capacity(v) == 25";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_empty_and_nonempty");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    sVar4 = scv_size(psVar2);
    if (sVar4 == 0) {
      iVar1 = scv_assign(psVar2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (((iVar1 != 0) || (sVar4 = scv_capacity(psVar2), sVar4 != 0x19)) ||
         (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x25a;
        greatest_info.msg = "res == SCV_OK && scv_capacity(v) == 25 && scv_size(v) == 0";
        goto LAB_001026c6;
      }
      iVar1 = scv_assign(psVar2,&local_f8,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x25e;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_001026c6;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x25f;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001026c6;
      }
      iVar1 = scv_assign(psVar2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x263;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
        goto LAB_001026c6;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x256;
      greatest_info.msg = "scv_size(v) == 0";
LAB_001026c6:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_less");
  if (iVar1 == 1) {
    local_e8 = 0xffffffff;
    uStack_e4 = 0xffffffff;
    uStack_e0 = 0xffffffff;
    local_f8 = 0xffffffffffffffff;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    local_118 = 0x100000000;
    uStack_110 = 0x300000002;
    local_108 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_assign(psVar2,&local_118,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x279;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_001027d8;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x27a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001027d8;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x275;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001027d8:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_more");
  if (iVar1 == 1) {
    uStack_110 = CONCAT44(uStack_110._4_4_,0xffffffff);
    local_118 = 0xffffffffffffffff;
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_118,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_assign(psVar2,&local_f8,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x290;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_001028eb;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x291;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001028eb;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x28c;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001028eb:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_null_data");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    sVar4 = scv_size(psVar2);
    if (sVar4 == 0) {
      iVar1 = scv_assign(psVar2,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x2a3;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
        goto LAB_001029c1;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x29f;
      greatest_info.msg = "scv_size(v) == 0";
LAB_001029c1:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_growing_capacity");
  if (iVar1 == 1) {
    uStack_110 = CONCAT44(uStack_110._4_4_,0xffffffff);
    local_118 = 0xffffffffffffffff;
    lVar6 = 0;
    auVar8 = _DAT_00109010;
    do {
      if (SUB164(auVar8 ^ _DAT_00109020,4) == -0x80000000 &&
          SUB164(auVar8 ^ _DAT_00109020,0) < -0x7fffffce) {
        *(int *)((long)&local_f8 + lVar6 * 4) = (int)lVar6;
        *(int *)((long)&local_f8 + lVar6 * 4 + 4) = (int)lVar6 + 1;
      }
      lVar6 = lVar6 + 2;
      lVar11 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar11 + 2;
    } while (lVar6 != 0x32);
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_118,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      sVar4 = scv_capacity(psVar2);
      if (sVar4 != 0x19) {
        greatest_info.fail_line = 699;
        greatest_info.msg = "scv_capacity(v) == 25";
        goto LAB_00102b64;
      }
      iVar1 = scv_assign(psVar2,&local_f8,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x2bf;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_00102b64;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      sVar4 = scv_capacity(psVar2);
      if (sVar4 < 0x32) {
        greatest_info.fail_line = 0x2c0;
        greatest_info.msg = "scv_capacity(v) >= ARRAY_SIZE(data2)";
        goto LAB_00102b64;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2c1;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102b64;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2ba;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102b64:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("assign_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x2d1;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_vector");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_replace(psVar2,0,0,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2e5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102cde;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2e4;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00102cde:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_start");
  if (iVar1 == 1) {
    local_f8 = 0x300000002;
    uStack_f0 = 4;
    local_118 = 0x100000000;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,0,0,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x2fb;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00102df4;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x2fc;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102df4;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x2f7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102df4:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_middle");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 4;
    local_118 = 0x300000002;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,2,2,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x312;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00102efc;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x313;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00102efc;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x30e;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00102efc:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_empty_range_end");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    local_118 = 0x400000003;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_replace(psVar2,3,3,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x329;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_0010300e;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x32a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010300e;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x325;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010300e:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_start");
  if (iVar1 == 1) {
    local_f8 = 0xffffffffffffffff;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    local_118 = 0x100000000;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,0,2,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x340;
        goto LAB_00103116;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x341;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010311d;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x33c;
LAB_00103116:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010311d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_middle");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    local_e8 = 4;
    local_118 = 0x300000002;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,2,4,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x357;
        goto LAB_00103228;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x358;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010322f;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x353;
LAB_00103228:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010322f:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_end");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 0xffffffff;
    local_e8 = 0xffffffff;
    local_118 = 0x400000003;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,3,sVar4,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x36e;
        goto LAB_00103340;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x36f;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103347;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x36a;
LAB_00103340:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103347:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_start_with_nothing");
  if (iVar1 == 1) {
    local_e8 = 2;
    uStack_e4 = 3;
    uStack_e0 = 4;
    local_f8 = 0xffffffffffffffff;
    uStack_f0 = 0;
    uStack_ec = 1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_replace(psVar2,0,2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 900;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103452;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x385;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103452;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x380;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103452:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_middle_with_nothing");
  if (iVar1 == 1) {
    local_e8 = 2;
    uStack_e4 = 3;
    uStack_e0 = 4;
    local_f8 = 0x100000000;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_replace(psVar2,2,4,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x39a;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103560;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x39b;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103560;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x396;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103560:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_end_with_nothing");
  if (iVar1 == 1) {
    local_e8 = 4;
    uStack_e4 = 0xffffffff;
    uStack_e0 = 0xffffffff;
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,sVar4 - 2,sVar5,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3b0;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00103682;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3b1;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103682;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3ac;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103682:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_less");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    local_e8 = 0xffffffff;
    uStack_e4 = 4;
    local_118 = 0x300000002;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,6);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 6)) {
      iVar1 = scv_replace(psVar2,2,5,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3c7;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 5";
        goto LAB_0010379a;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3c8;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010379a;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3c3;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_0010379a:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_more");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 0xffffffff;
    uStack_ec = 4;
    local_118 = 0x300000002;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,4);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 4)) {
      iVar1 = scv_replace(psVar2,2,3,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3de;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 5";
        goto LAB_001038a4;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3df;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001038a4;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3da;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001038a4:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_all_with_less");
  if (iVar1 == 1) {
    local_e8 = 0xffffffff;
    uStack_e4 = 0xffffffff;
    uStack_e0 = 0xffffffff;
    local_f8 = 0xffffffffffffffff;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    local_118 = 0x100000000;
    uStack_110 = 0x300000002;
    local_108 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,&local_118,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x3f5;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_001039c4;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x3f6;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001039c4;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x3f1;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001039c4:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_all_with_more");
  if (iVar1 == 1) {
    uStack_110 = CONCAT44(uStack_110._4_4_,0xffffffff);
    local_118 = 0xffffffffffffffff;
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_118,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,&local_f8,5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x40c;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data2)";
        goto LAB_00103ae5;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x40d;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103ae5;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x408;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103ae5:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_with_null_data");
  if (iVar1 == 1) {
    uStack_f0 = 0xffffffff;
    local_f8 = 0xffffffffffffffff;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,0,sVar4,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x422;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
        goto LAB_00103bd9;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x41e;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103bd9:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_growing_capacity");
  if (iVar1 == 1) {
    local_118 = 0x2e0000002d;
    uStack_110 = 0x300000002f;
    local_108 = 0x31;
    lVar6 = 0;
    auVar9 = _DAT_00109010;
    do {
      if (SUB164(auVar9 ^ _DAT_00109020,4) == -0x80000000 &&
          SUB164(auVar9 ^ _DAT_00109020,0) < -0x7fffffd3) {
        *(int *)((long)&local_f8 + lVar6 * 4) = (int)lVar6;
        *(int *)((long)&local_f8 + lVar6 * 4 + 4) = (int)lVar6 + 1;
      }
      lVar6 = lVar6 + 2;
      lVar11 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar11 + 2;
    } while (lVar6 != 0x2e);
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_118,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,0,0,&local_f8,0x2d);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x43d;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_00103d4c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x43e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103d4c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x439;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_00103d4c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_replace(psVar2,0,0,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x44e;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_outside_range");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_replace(psVar2,2,sVar4 + 1,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x463;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00103f03;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x464;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00103f03;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x45f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00103f03:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("replace_negative_range");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_replace(psVar2,3,2,(void *)0x0,1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x479;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00104010;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x47a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104010;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x475;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104010:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_empty_vector");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x48e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001040e5;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x48d;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_001040e5:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_start");
  if (iVar1 == 1) {
    local_f8 = 0x300000002;
    uStack_f0 = 4;
    local_118 = 0x100000000;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,0,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4a4;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_001041e6;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4a5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001041e6;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4a0;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001041e6:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_middle");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 4;
    local_118 = 0x300000002;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,2,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4bb;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_001042ea;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4bc;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001042ea;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4b7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001042ea:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_end");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    local_118 = 0x400000003;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4,&local_118,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4d2;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_001043f4;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4d3;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001043f4;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4ce;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001043f4:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_nothing");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_insert(psVar2,0,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4e8;
        goto LAB_0010458c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4e9;
LAB_0010684e:
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104593;
      }
      iVar1 = scv_insert(psVar2,2,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4ed;
        goto LAB_0010458c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4ee;
        goto LAB_0010684e;
      }
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x4f2;
        goto LAB_0010458c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x4f3;
        goto LAB_0010684e;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x4e4;
LAB_0010458c:
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104593:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_null_data");
  if (iVar1 == 1) {
    uStack_f0 = 0xffffffff;
    local_f8 = 0xffffffffffffffff;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,3);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 3)) {
      iVar1 = scv_insert(psVar2,0,(void *)0x0,0x32);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x35)) {
        greatest_info.fail_line = 0x508;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) + 50";
        goto LAB_0010467d;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x504;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010467d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_growing_capacity");
  if (iVar1 == 1) {
    local_118 = 0x2e0000002d;
    uStack_110 = 0x300000002f;
    local_108 = 0x31;
    lVar6 = 0;
    auVar10 = _DAT_00109010;
    do {
      if (SUB164(auVar10 ^ _DAT_00109020,4) == -0x80000000 &&
          SUB164(auVar10 ^ _DAT_00109020,0) < -0x7fffffd3) {
        *(int *)((long)&local_f8 + lVar6 * 4) = (int)lVar6;
        *(int *)((long)&local_f8 + lVar6 * 4 + 4) = (int)lVar6 + 1;
      }
      lVar6 = lVar6 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (lVar6 != 0x2e);
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_118,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_insert(psVar2,0,&local_f8,0x2d);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0x32)) {
        greatest_info.fail_line = 0x523;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1) + ARRAY_SIZE(data2)";
        goto LAB_001047ef;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x524;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001047ef;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x51f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data1)";
LAB_001047ef:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_nobj_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,(void *)0x0,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x534;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("insert_outside_range");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_insert(psVar2,0,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_insert(psVar2,sVar4 + 1,(void *)0x0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x549;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_001049a0;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x54a;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_001049a0;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x545;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_001049a0:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_nothing");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_erase(psVar2,0,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_resize(psVar2,10);
      iVar1 = scv_erase(psVar2,0,0);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 10)) {
        greatest_info.fail_line = 0x562;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 10";
        goto LAB_00104a27;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x55c;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
LAB_00104a27:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_start");
  if (iVar1 == 1) {
    local_e8 = 2;
    uStack_e4 = 3;
    uStack_e0 = 4;
    local_f8 = 0xffffffffffffffff;
    uStack_f0 = 0;
    uStack_ec = 1;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_erase(psVar2,0,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x577;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00104b2d;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x578;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104b2d;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x573;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104b2d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_middle");
  if (iVar1 == 1) {
    local_e8 = 2;
    uStack_e4 = 3;
    uStack_e0 = 4;
    local_f8 = 0x100000000;
    uStack_f0 = 0xffffffff;
    uStack_ec = 0xffffffff;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      iVar1 = scv_erase(psVar2,2,4);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x58d;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00104c36;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x58e;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104c36;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x589;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104c36:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_end");
  if (iVar1 == 1) {
    local_e8 = 4;
    uStack_e4 = 0xffffffff;
    uStack_e0 = 0xffffffff;
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 7)) {
      sVar4 = scv_size(psVar2);
      sVar5 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,sVar4 - 2,sVar5);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5a3;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 2";
        goto LAB_00104d4f;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5a4;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104d4f;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x59f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104d4f:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_all");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,0,sVar4);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
        greatest_info.fail_line = 0x5b9;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
        goto LAB_00104e46;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5b5;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104e46:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_outside_range");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      sVar4 = scv_size(psVar2);
      iVar1 = scv_erase(psVar2,2,sVar4 + 1);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5ce;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00104f52;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5cf;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00104f52;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5ca;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00104f52:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("erase_negative_range");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_erase(psVar2,3,2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 5)) {
        greatest_info.fail_line = 0x5e4;
        greatest_info.msg = "res != SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
        goto LAB_00105057;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5e5;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00105057;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5e0;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_00105057:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back_empty");
  if (iVar1 == 1) {
    local_f8 = local_f8 & 0xffffffff00000000;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_push_back(psVar2,&local_f8);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 1)) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x5f9;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00105117;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x5f8;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 1";
LAB_00105117:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    local_118 = CONCAT44(local_118._4_4_,5);
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_push_back(psVar2,&local_118);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 6)) {
        greatest_info.fail_line = 0x60f;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) + 1";
        goto LAB_0010521c;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x610;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010521c;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x60b;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010521c:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("push_back_growing_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    local_f8 = local_f8 & 0xffffffff00000000;
    do {
      iVar1 = scv_push_back(psVar2,&local_f8);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar1 != 0) {
LAB_001052d0:
        greatest_info.fail_line = 0x621;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == (size_t) i + 1";
LAB_00105310:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
        iVar1 = -1;
        if ((greatest_info.flags & 4) == 0) goto LAB_00105329;
        goto LAB_00106a0f;
      }
      sVar4 = scv_size(psVar2);
      if (sVar4 != (long)(int)local_f8 + 1U) goto LAB_001052d0;
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x622;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_00105310;
      }
      iVar1 = (int)local_f8;
      local_f8 = CONCAT44(local_f8._4_4_,(int)local_f8 + 1);
    } while (iVar1 < 0x1d);
    scv_delete(psVar2);
    greatest_info.msg = (char *)0x0;
    iVar1 = 0;
LAB_00105329:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pop_back");
  if (iVar1 == 1) {
    local_f8 = 0x100000000;
    uStack_f0 = 2;
    uStack_ec = 3;
    local_e8 = 4;
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_assign(psVar2,&local_f8,5);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      iVar1 = scv_pop_back(psVar2);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((iVar1 != 0) || (sVar4 = scv_size(psVar2), sVar4 != 4)) {
        greatest_info.fail_line = 0x63a;
        greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data) - 1";
        goto LAB_0010540b;
      }
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = check_int_vector(psVar2);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x63b;
        greatest_info.msg = "check_int_vector(v)";
        goto LAB_0010540b;
      }
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x636;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == ARRAY_SIZE(data)";
LAB_0010540b:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("pop_back_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_pop_back(psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) || (sVar4 = scv_size(psVar2), sVar4 != 0)) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x64b;
      greatest_info.msg = "res != SCV_OK && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_zero_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x65f;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_smaller_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x19);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x19)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x671;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 25";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_equal_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x32);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x32)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x683;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 50";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_larger_size");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x4b);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x4b)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x695;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 75";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_larger_capacity");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    scv_assign(psVar2,(void *)0x0,0x32);
    iVar1 = scv_resize(psVar2,0x7d);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (sVar4 = scv_size(psVar2), sVar4 == 0x7d)) {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6a7;
      greatest_info.msg = "res == SCV_OK && scv_size(v) == 125";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("resize_size_max");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    iVar1 = scv_resize(psVar2,0xffffffffffffffff);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6b7;
      greatest_info.msg = "res != SCV_OK";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_empty_to_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6cb;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_empty_to_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar2,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 0)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6e0;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_empty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar7,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x6f5;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 5";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_nonempty");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(4,0x32);
    scv_insert(psVar2,0,(void *)0x0,10);
    scv_insert(psVar7,0,(void *)0x0,5);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_size(psVar2), sVar4 == 5)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x70b;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_size(v1) == 5";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_objsize_mismatch");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    psVar7 = scv_new(2,0x32);
    iVar1 = scv_copy(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x71e;
      greatest_info.msg = "res != SCV_OK";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("copy_to_itself");
  if (iVar1 == 1) {
    psVar2 = scv_new(4,0x19);
    iVar1 = scv_copy(psVar2,psVar2);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x72f;
      greatest_info.msg = "res != SCV_OK";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00106a0f;
    }
    else {
      scv_delete(psVar2);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("swap");
  if (iVar1 == 1) {
    psVar2 = scv_new(1,100);
    psVar7 = scv_new(4,0x19);
    iVar1 = scv_swap(psVar2,psVar7);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (sVar4 = scv_capacity(psVar2), sVar4 == 0x19)) &&
       (sVar4 = scv_capacity(psVar7), sVar4 == 100)) {
      scv_delete(psVar2);
      scv_delete(psVar7);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
      greatest_info.fail_line = 0x743;
      greatest_info.msg = "res == SCV_OK && scv_capacity(v1) == 25 && scv_capacity(v2) == 100";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) {
LAB_00106a0f:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/test/test_scv.c";
        abort();
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(scv)
{
	RUN_TEST(new_objsize_zero);
	RUN_TEST(new_capacity_zero);
	RUN_TEST(new_objsize_max);
	RUN_TEST(new_capacity_max);

	RUN_TEST(delete_null);

	RUN_TEST(at_inside);
	RUN_TEST(at_outside);
	RUN_TEST(at_empty);

	RUN_TEST(front_nonempty);
	RUN_TEST(front_empty);

	RUN_TEST(back_nonempty);
	RUN_TEST(back_single);
	RUN_TEST(back_empty);

	RUN_TEST(data_nonempty);
	RUN_TEST(data_empty);

	RUN_TEST(empty_empty);
	RUN_TEST(empty_nonempty);

	RUN_TEST(size_empty);
	RUN_TEST(size_nonempty);

	RUN_TEST(objsize);

	RUN_TEST(reserve_zero);
	RUN_TEST(reserve_below_size);
	RUN_TEST(reserve_equals_size);
	RUN_TEST(reserve_above_size);
	RUN_TEST(reserve_above_capacity);
	RUN_TEST(reserve_capacity_max);

	RUN_TEST(capacity);

	RUN_TEST(shrink_to_fit_empty);
	RUN_TEST(shrink_to_fit_size_equals_capacity);
	RUN_TEST(shrink_to_fit_size_below_capacity);

	RUN_TEST(clear_nonempty);
	RUN_TEST(clear_empty);

	RUN_TEST(assign_empty_and_nonempty);
	RUN_TEST(assign_less);
	RUN_TEST(assign_more);
	RUN_TEST(assign_null_data);
	RUN_TEST(assign_growing_capacity);
	RUN_TEST(assign_nobj_max);

	RUN_TEST(replace_empty_vector);
	RUN_TEST(replace_empty_range_start);
	RUN_TEST(replace_empty_range_middle);
	RUN_TEST(replace_empty_range_end);
	RUN_TEST(replace_start);
	RUN_TEST(replace_middle);
	RUN_TEST(replace_end);
	RUN_TEST(replace_start_with_nothing);
	RUN_TEST(replace_middle_with_nothing);
	RUN_TEST(replace_end_with_nothing);
	RUN_TEST(replace_with_less);
	RUN_TEST(replace_with_more);
	RUN_TEST(replace_all_with_less);
	RUN_TEST(replace_all_with_more);
	RUN_TEST(replace_with_null_data);
	RUN_TEST(replace_growing_capacity);
	RUN_TEST(replace_nobj_max);
	RUN_TEST(replace_outside_range);
	RUN_TEST(replace_negative_range);

	RUN_TEST(insert_empty_vector);
	RUN_TEST(insert_start);
	RUN_TEST(insert_middle);
	RUN_TEST(insert_end);
	RUN_TEST(insert_nothing);
	RUN_TEST(insert_null_data);
	RUN_TEST(insert_growing_capacity);
	RUN_TEST(insert_nobj_max);
	RUN_TEST(insert_outside_range);

	RUN_TEST(erase_nothing);
	RUN_TEST(erase_start);
	RUN_TEST(erase_middle);
	RUN_TEST(erase_end);
	RUN_TEST(erase_all);
	RUN_TEST(erase_outside_range);
	RUN_TEST(erase_negative_range);

	RUN_TEST(push_back_empty);
	RUN_TEST(push_back);
	RUN_TEST(push_back_growing_capacity);

	RUN_TEST(pop_back);
	RUN_TEST(pop_back_empty);

	RUN_TEST(resize_zero_size);
	RUN_TEST(resize_smaller_size);
	RUN_TEST(resize_equal_size);
	RUN_TEST(resize_larger_size);
	RUN_TEST(resize_larger_capacity);
	RUN_TEST(resize_size_max);

	RUN_TEST(copy_empty_to_empty);
	RUN_TEST(copy_empty_to_nonempty);
	RUN_TEST(copy_nonempty_to_empty);
	RUN_TEST(copy_nonempty_to_nonempty);
	RUN_TEST(copy_objsize_mismatch);
	RUN_TEST(copy_to_itself);

	RUN_TEST(swap);
}